

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::IsRFC1918(CNetAddr *this)

{
  char cVar1;
  long in_FS_OFFSET;
  bool bVar2;
  
  if (this->m_net == NET_IPV4) {
    if (0x10 < (this->m_addr)._size) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    cVar1 = (this->m_addr)._union.direct[0];
    bVar2 = true;
    if (cVar1 == '\n') goto LAB_006cf54c;
    if (cVar1 == -0x54) {
      bVar2 = ((this->m_addr)._union.direct[1] & 0xf0U) == 0x10;
      goto LAB_006cf54c;
    }
    if ((cVar1 == -0x40) && ((this->m_addr)._union.direct[1] == -0x58)) goto LAB_006cf54c;
  }
  bVar2 = false;
LAB_006cf54c:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC1918() const
{
    return IsIPv4() && (
        m_addr[0] == 10 ||
        (m_addr[0] == 192 && m_addr[1] == 168) ||
        (m_addr[0] == 172 && m_addr[1] >= 16 && m_addr[1] <= 31));
}